

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,Timer *timer,HttpHeaderTable *responseHeaderTable,Network *network,
                 Maybe<kj::Network_&> *tlsNetwork,HttpClientSettings *settings)

{
  HttpClientSettings *params_4;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar1;
  HttpClientSettings *local_38;
  HttpClientSettings *settings_local;
  Maybe<kj::Network_&> *tlsNetwork_local;
  Network *network_local;
  HttpHeaderTable *responseHeaderTable_local;
  Timer *timer_local;
  
  local_38 = settings;
  settings_local = (HttpClientSettings *)tlsNetwork;
  tlsNetwork_local = (Maybe<kj::Network_&> *)network;
  network_local = (Network *)responseHeaderTable;
  responseHeaderTable_local = (HttpHeaderTable *)timer;
  timer_local = (Timer *)this;
  params_4 = mv<kj::HttpClientSettings>(settings);
  heap<kj::(anonymous_namespace)::NetworkHttpClient,kj::Timer&,kj::HttpHeaderTable_const&,kj::Network&,kj::Maybe<kj::Network&>&,kj::HttpClientSettings>
            ((kj *)&stack0xffffffffffffffb8,timer,responseHeaderTable,network,tlsNetwork,params_4);
  Own<kj::HttpClient,decltype(nullptr)>::Own<kj::(anonymous_namespace)::NetworkHttpClient,void>
            ((Own<kj::HttpClient,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::NetworkHttpClient,_std::nullptr_t> *)
             &stack0xffffffffffffffb8);
  Own<kj::(anonymous_namespace)::NetworkHttpClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkHttpClient,_std::nullptr_t> *)
             &stack0xffffffffffffffb8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<HttpClient> newHttpClient(kj::Timer& timer, const HttpHeaderTable& responseHeaderTable,
                                  kj::Network& network, kj::Maybe<kj::Network&> tlsNetwork,
                                  HttpClientSettings settings) {
  return kj::heap<NetworkHttpClient>(
      timer, responseHeaderTable, network, tlsNetwork, kj::mv(settings));
}